

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
spdlog::logger::logger<std::shared_ptr<spdlog::sinks::sink>const*>
          (logger *this,string *name,shared_ptr<spdlog::sinks::sink> *begin,
          shared_ptr<spdlog::sinks::sink> *end)

{
  vector<std::shared_ptr<spdlog::sinks::sink>,_std::allocator<std::shared_ptr<spdlog::sinks::sink>_>_>
  *in_RCX;
  string *in_RSI;
  backtracer *in_RDI;
  string *this_00;
  allocator_type *in_stack_ffffffffffffffc8;
  shared_ptr<spdlog::sinks::sink> *in_stack_ffffffffffffffd0;
  shared_ptr<spdlog::sinks::sink> *in_stack_ffffffffffffffd8;
  
  *(undefined ***)&(in_RDI->mutex_).super___mutex_base = &PTR__logger_00278e28;
  this_00 = (string *)((long)&((_Any_data *)&(in_RDI->mutex_).super___mutex_base)->_M_unused + 8);
  std::__cxx11::string::string(this_00,in_RSI);
  std::allocator<std::shared_ptr<spdlog::sinks::sink>_>::allocator
            ((allocator<std::shared_ptr<spdlog::sinks::sink>_> *)0x1adcca);
  std::
  vector<std::shared_ptr<spdlog::sinks::sink>,std::allocator<std::shared_ptr<spdlog::sinks::sink>>>
  ::vector<std::shared_ptr<spdlog::sinks::sink>const*,void>
            (in_RCX,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  std::allocator<std::shared_ptr<spdlog::sinks::sink>_>::~allocator
            ((allocator<std::shared_ptr<spdlog::sinks::sink>_> *)0x1adcef);
  std::atomic<int>::atomic((atomic<int> *)in_RDI,(__integral_type)((ulong)this_00 >> 0x20));
  std::atomic<int>::atomic((atomic<int> *)in_RDI,(__integral_type)((ulong)this_00 >> 0x20));
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_RDI,this_00);
  details::backtracer::backtracer(in_RDI);
  return;
}

Assistant:

logger(std::string name, It begin, It end)
        : name_(std::move(name))
        , sinks_(begin, end)
    {}